

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestVerifyBigFieldNumberUint32_Nested::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar2;
  int line;
  Arena *arena;
  TestVerifyBigFieldNumberUint32_Nested *_this;
  TestVerifyBigFieldNumberUint32_Nested *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestVerifyBigFieldNumberUint32_Nested *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestVerifyBigFieldNumberUint32_Nested_const*,edition_unittest::TestVerifyBigFieldNumberUint32_Nested*>
                          ((TestVerifyBigFieldNumberUint32_Nested **)local_28,&local_30,
                           "&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0xcc48;
LAB_009d72a1:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  google::protobuf::RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>::
  MergeFrom(&(local_30->field_0)._impl_.repeated_nested_,
            (RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *)
            &from_msg[1]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[3]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_nested_ != nullptr";
        line = 0xcc51;
        goto LAB_009d72a1;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar2 = google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>
                           (arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x20) = pvVar2;
      }
      else {
        MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(int *)((long)&local_30->field_0 + 0x28) = (int)from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 4) != 0) {
      (local_30->field_0)._impl_.optional_uint32_2_ =
           *(uint32_t *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 8) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar1 & 0x10) != 0) {
      (local_30->field_0)._impl_.optional_uint32_64_ =
           *(uint32_t *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 0x20) != 0) {
      *(int *)((long)&local_30->field_0 + 0x38) = (int)from_msg[4]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x40) != 0) {
      (local_30->field_0)._impl_.optional_uint32_66_ =
           *(uint32_t *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
    }
    if ((char)uVar1 < '\0') {
      *(undefined4 *)((long)&local_30->field_0 + 0x40) =
           *(undefined4 *)&from_msg[5]._vptr_MessageLite;
    }
  }
  if ((uVar1 >> 8 & 1) != 0) {
    (local_30->field_0)._impl_.optional_uint32_5000_ =
         *(uint32_t *)((long)&from_msg[5]._vptr_MessageLite + 4);
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestVerifyBigFieldNumberUint32_Nested::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestVerifyBigFieldNumberUint32_Nested*>(&to_msg);
  auto& from = static_cast<const TestVerifyBigFieldNumberUint32_Nested&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_nested()->MergeFrom(
      from._internal_repeated_nested());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_ != nullptr);
      if (_this->_impl_.optional_nested_ == nullptr) {
        _this->_impl_.optional_nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_);
      } else {
        _this->_impl_.optional_nested_->MergeFrom(*from._impl_.optional_nested_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_uint32_1_ = from._impl_.optional_uint32_1_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.optional_uint32_2_ = from._impl_.optional_uint32_2_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.optional_uint32_63_ = from._impl_.optional_uint32_63_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_uint32_64_ = from._impl_.optional_uint32_64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.optional_uint32_65_ = from._impl_.optional_uint32_65_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_uint32_66_ = from._impl_.optional_uint32_66_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.optional_uint32_1000_ = from._impl_.optional_uint32_1000_;
    }
  }
  if ((cached_has_bits & 0x00000100u) != 0) {
    _this->_impl_.optional_uint32_5000_ = from._impl_.optional_uint32_5000_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}